

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void __thiscall
rtosc::MergePorts::MergePorts(MergePorts *this,initializer_list<const_rtosc::Ports_*> c)

{
  iterator ppPVar1;
  value_type *pvVar2;
  pointer pPVar3;
  char *__s2;
  bool bVar4;
  int iVar5;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range3;
  bool bVar6;
  iterator ppPVar7;
  Port *pp;
  pointer pPVar8;
  Port *p;
  value_type *__x;
  
  ppPVar7 = c._M_array;
  Ports::Ports(&this->super_Ports,(initializer_list<rtosc::Port>)ZEXT816(0));
  if (c._M_len != 0) {
    ppPVar1 = ppPVar7 + c._M_len;
    do {
      pvVar2 = ((*ppPVar7)->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (__x = ((*ppPVar7)->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                 _M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
        pPVar8 = (this->super_Ports).ports.
                 super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar3 = (this->super_Ports).ports.
                 super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pPVar8 == pPVar3) {
LAB_001070aa:
          std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::push_back
                    ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)this,__x);
        }
        else {
          __s2 = __x->name;
          bVar4 = false;
          do {
            bVar6 = bVar4;
            iVar5 = strcmp(pPVar8->name,__s2);
            pPVar8 = pPVar8 + 1;
            bVar4 = (bool)(bVar6 | iVar5 == 0);
          } while (pPVar8 != pPVar3);
          if (!bVar6 && iVar5 != 0) goto LAB_001070aa;
        }
      }
      ppPVar7 = ppPVar7 + 1;
    } while (ppPVar7 != ppPVar1);
  }
  Ports::refreshMagic(&this->super_Ports);
  return;
}

Assistant:

MergePorts::MergePorts(std::initializer_list<const rtosc::Ports*> c)
    :Ports({})
{
    //XXX TODO remove duplicates in some sane and documented way
    //e.g. repeated ports override and remove older ones
    for(auto *to_clone:c) {
        assert(to_clone);
        for(auto &p:to_clone->ports) {
            bool already_there = false;
            for(auto &pp:ports)
                if(!strcmp(pp.name, p.name))
                    already_there = true;

            if(!already_there)
                ports.push_back(p);
        }
    }

    refreshMagic();
}